

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::smallestHoleAtLeast
          (DataLocationUsage *this,DataLocation *location,uint lgSize)

{
  undefined8 in_RAX;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint *puVar1;
  char local_28;
  uint local_24;
  
  puVar1 = (uint *)CONCAT44(in_register_00000014,lgSize);
  if ((char)location->lgSize == '\0') {
    local_24 = *puVar1;
    if (in_ECX <= local_24) goto LAB_00162b6d;
  }
  else {
    if (in_ECX < *(byte *)((long)&location->lgSize + 1)) {
      HoleSet<unsigned_char>::smallestAtLeast
                ((HoleSet<unsigned_char> *)((long)&location->lgSize + 2),in_ECX);
      local_28 = (char)in_RAX;
      if (local_28 == '\x01') {
        local_24 = (uint)((ulong)in_RAX >> 0x20);
      }
      else {
        local_24 = (uint)*(byte *)((long)&location->lgSize + 1);
        if (*puVar1 <= local_24) goto LAB_00162b8c;
      }
LAB_00162b6d:
      this->isUsed = true;
      *(uint *)((this->holes).holes + 2) = local_24;
      return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
    }
    if (in_ECX < *puVar1) {
      this->isUsed = true;
      *(uint *)((this->holes).holes + 2) = in_ECX;
      return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
    }
  }
LAB_00162b8c:
  this->isUsed = false;
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<uint> smallestHoleAtLeast(Union::DataLocation& location, uint lgSize) {
        // Find the smallest single hole that is at least the given size.  This is used to find the
        // optimal place to allocate each field -- it is placed in the smallest slot where it fits,
        // to reduce fragmentation.  Returns the size of the hole, if found.

        if (!isUsed) {
          // The location is effectively one big hole.
          if (lgSize <= location.lgSize) {
            return location.lgSize;
          } else {
            return kj::none;
          }
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any current
          // holes, but if the location's size is larger than what we're using, we'd be able to
          // expand.
          if (lgSize < location.lgSize) {
            return lgSize;
          } else {
            return kj::none;
          }
        } else KJ_IF_SOME(result, holes.smallestAtLeast(lgSize)) {
          // There's a hole.
          return result;
        } else {
          // The requested size is smaller than what we're already using, but there are no holes
          // available.  If we could double our size, then we could allocate in the new space.

          if (lgSizeUsed < location.lgSize) {
            // We effectively create a new hole the same size as the current usage.
            return lgSizeUsed;
          } else {
            return kj::none;
          }
        }
      }